

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizeRecGroups.cpp
# Opt level: O1

void __thiscall wasm::anon_unknown_0::MinimizeRecGroups::run(MinimizeRecGroups *this,Module *module)

{
  unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
  *puVar1;
  __node_base_ptr this_00;
  vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
  *this_01;
  unordered_map<wasm::RecGroupShape,_unsigned_int,_std::hash<wasm::RecGroupShape>,_std::equal_to<wasm::RecGroupShape>,_std::allocator<std::pair<const_wasm::RecGroupShape,_unsigned_int>_>_>
  *puVar2;
  DisjointSets *this_02;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_03;
  pointer *ppRVar3;
  iterator __position;
  pointer pRVar4;
  pointer pRVar5;
  pointer __first;
  pointer puVar6;
  iterator __position_00;
  pointer pHVar7;
  pointer pFVar8;
  void *pvVar9;
  GroupClassInfo *this_04;
  undefined1 auVar10 [8];
  _Storage<wasm::HeapType,_true> _Var11;
  undefined1 uVar12;
  bool bVar13;
  Shareability share;
  HeapTypeKind HVar14;
  pointer __result;
  size_t sVar15;
  ulong uVar16;
  pointer pRVar17;
  pointer pRVar18;
  RecGroupInfo *__args;
  size_t sVar19;
  iterator iVar20;
  Type TVar21;
  Type TVar22;
  Struct *pSVar23;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *__x;
  pointer pHVar24;
  mapped_type *pmVar25;
  _Storage<wasm::HeapType,_true> _Var26;
  ulong uVar27;
  _Tp_alloc_type *__alloc;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *extraout_RDX;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *extraout_RDX_00;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *extraout_RDX_01;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *extraout_RDX_02;
  GroupClassInfo *classInfo;
  _Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
  *p_Var28;
  __node_base __n;
  int iVar29;
  long lVar30;
  optional<wasm::(anonymous_namespace)::GroupClassInfo> *poVar31;
  RecGroupInfo *__args_00;
  uint uVar32;
  uint uVar33;
  long *plVar34;
  MinimizeRecGroups *pMVar35;
  pointer pFVar36;
  __hashtable *__h_1;
  _Hash_node_base *p_Var37;
  SCC SVar38;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::RecGroupShape,_unsigned_int>,_false,_true>,_bool>
  pVar39;
  optional<wasm::HeapType> oVar40;
  Signature SVar41;
  optional<wasm::HeapType> desc;
  optional<wasm::HeapType> desc_00;
  undefined1 local_330 [8];
  InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> typeInfo;
  unordered_set<wasm::RecGroup,_std::hash<wasm::RecGroup>,_std::equal_to<wasm::RecGroup>,_std::allocator<wasm::RecGroup>_>
  publicGroups;
  _Storage<wasm::HeapType,_true> _Stack_298;
  vector<wasm::Field,_std::allocator<wasm::Field>_> fields;
  undefined8 auStack_228 [2];
  undefined1 local_218;
  undefined1 local_208;
  _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_200;
  GroupClassInfo *local_1c0;
  _Storage<wasm::HeapType,_true> local_1b8;
  unordered_map<wasm::HeapType,_unsigned_int,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
  outputIndices;
  long local_170;
  void *local_160;
  long local_150;
  undefined1 auStack_148 [8];
  RecGroup group;
  __node_base local_138;
  pointer puStack_130;
  float local_128;
  undefined4 uStack_124;
  __node_base_ptr p_Stack_118;
  pointer local_110;
  pointer local_100;
  pointer local_f0;
  pointer local_e0;
  undefined1 local_d0 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  deps;
  vector<unsigned_int,_std::allocator<unsigned_int>_> permutation;
  uint local_8c;
  undefined1 auStack_88 [4];
  Index index;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> sccTypes;
  _Storage<wasm::HeapType,_true> local_50;
  Iterator __begin2;
  __hashtable *__h_2;
  Index other;
  
  if (((module->features).features & 0x400) != 0) {
    _other = this;
    if (wasm::(anonymous_namespace)::MinimizeRecGroups::initBrandOptions()::fieldsInitialized ==
        '\0') {
      _GLOBAL__N_1::MinimizeRecGroups::run();
    }
    _Var26 = (_Storage<wasm::HeapType,_true>)0x1;
    wasm::ModuleUtils::collectHeapTypeInfo
              ((InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> *)local_330,module
               ,AllTypes,FindVisibility);
    __begin2.scc.parent = (SCC)&_other->types;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::reserve
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)__begin2.scc.parent,
               (size_type)typeInfo.Map._M_h._M_before_begin._M_nxt);
    pMVar35 = _other;
    typeInfo.List.
    super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
    ._M_impl._M_node._M_size = (size_t)&publicGroups._M_h._M_rehash_policy._M_next_resize;
    publicGroups._M_h._M_buckets = (__buckets_ptr)0x1;
    publicGroups._M_h._M_bucket_count = 0;
    publicGroups._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    publicGroups._M_h._M_element_count._0_4_ = 0x3f800000;
    publicGroups._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    publicGroups._M_h._M_rehash_policy._4_4_ = 0;
    publicGroups._M_h._M_rehash_policy._M_next_resize = 0;
    if (typeInfo.Map._M_h._M_single_bucket != (__node_base_ptr)&typeInfo.Map._M_h._M_single_bucket)
    {
      puVar1 = &_other->typeIndices;
      p_Var37 = typeInfo.Map._M_h._M_single_bucket;
      do {
        this_00 = p_Var37 + 2;
        if (*(int *)((long)&p_Var37[3]._M_nxt + 4) == 2) {
          __position._M_current =
               (pMVar35->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (pMVar35->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
            _M_realloc_insert<wasm::HeapType_const&>
                      ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)__begin2.scc.parent,
                       __position,(HeapType *)this_00);
          }
          else {
            (__position._M_current)->id = (uintptr_t)this_00->_M_nxt;
            (pMVar35->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
            _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          _Var26 = (_Storage<wasm::HeapType,_true>)this_00->_M_nxt;
          fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(fields.
                                 super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                 _M_impl.super__Vector_impl_data._M_start._4_4_,
                                 (int)(pMVar35->typeIndices)._M_h._M_element_count);
          _Stack_298 = _Var26;
          std::
          _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<wasm::HeapType_const,unsigned_int>>
                    ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)puVar1,&_Stack_298);
        }
        else {
          local_1b8._M_value.id = (HeapType)HeapType::getRecGroup((HeapType *)this_00);
          _Stack_298 = (_Storage<wasm::HeapType,_true>)
                       &typeInfo.List.
                        super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                        ._M_impl._M_node._M_size;
          std::
          _Hashtable<wasm::RecGroup,wasm::RecGroup,std::allocator<wasm::RecGroup>,std::__detail::_Identity,std::equal_to<wasm::RecGroup>,std::hash<wasm::RecGroup>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
          ::
          _M_insert<wasm::RecGroup,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::RecGroup,true>>>>
                    ((_Hashtable<wasm::RecGroup,wasm::RecGroup,std::allocator<wasm::RecGroup>,std::__detail::_Identity,std::equal_to<wasm::RecGroup>,std::hash<wasm::RecGroup>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                      *)_Stack_298,&local_1b8,&_Stack_298);
        }
        p_Var37 = p_Var37->_M_nxt;
      } while (p_Var37 != (_Hash_node_base *)&typeInfo.Map._M_h._M_single_bucket);
    }
    this_01 = &_other->publicGroupTypes;
    __n._M_nxt = publicGroups._M_h._M_before_begin._M_nxt;
    std::
    vector<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
    ::reserve(this_01,(size_type)publicGroups._M_h._M_before_begin._M_nxt);
    if (publicGroups._M_h._M_bucket_count != 0) {
      puVar2 = &_other->groupShapeIndices;
      plVar34 = (long *)publicGroups._M_h._M_bucket_count;
      do {
        auStack_148 = (undefined1  [8])plVar34[1];
        fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        _Stack_298 = (_Storage<wasm::HeapType,_true>)auStack_148;
        outputIndices._M_h._M_buckets = (__buckets_ptr)RecGroup::size((RecGroup *)auStack_148);
        local_1b8 = (_Storage<wasm::HeapType,_true>)auStack_148;
        std::
        vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
        ::emplace_back<wasm::RecGroup::Iterator,wasm::RecGroup::Iterator>
                  ((vector<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,std::allocator<std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
                    *)this_01,(Iterator *)&_Stack_298._M_value,(Iterator *)&local_1b8._M_value);
        _Stack_298 = (_Storage<wasm::HeapType,_true>)
                     ((_other->publicGroupTypes).
                      super__Vector_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_std::allocator<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish + -1);
        fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)CONCAT44(fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                               _M_impl.super__Vector_impl_data._M_start._4_4_,0xffffffff);
        __n._M_nxt = (_Hash_node_base *)&_Stack_298;
        pVar39 = std::
                 _Hashtable<wasm::RecGroupShape,std::pair<wasm::RecGroupShape_const,unsigned_int>,std::allocator<std::pair<wasm::RecGroupShape_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::RecGroupShape>,std::hash<wasm::RecGroupShape>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                 ::_M_emplace<std::pair<wasm::RecGroupShape_const,unsigned_int>>
                           ((_Hashtable<wasm::RecGroupShape,std::pair<wasm::RecGroupShape_const,unsigned_int>,std::allocator<std::pair<wasm::RecGroupShape_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::RecGroupShape>,std::hash<wasm::RecGroupShape>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                             *)puVar2);
        if (((undefined1  [16])pVar39 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          __assert_fail("inserted",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                        ,0x196,
                        "virtual void wasm::(anonymous namespace)::MinimizeRecGroups::run(Module *)"
                       );
        }
        plVar34 = (long *)*plVar34;
      } while (plVar34 != (long *)0x0);
    }
    p_Var28 = (_Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
               *)((long)(_other->types).
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(_other->types).
                        super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3);
    if ((ulong)p_Var28 >> 0x37 != 0) {
      std::__throw_length_error("vector::reserve");
    }
    pRVar17 = (_other->groups).
              super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pMVar35 = _other;
    if ((_Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
         *)((long)(_other->groups).
                  super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pRVar17 >> 8) < p_Var28
       ) {
      pRVar4 = (_other->groups).
               super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      __result = std::
                 _Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                 ::_M_allocate(p_Var28,(size_t)__n._M_nxt);
      pMVar35 = _other;
      std::
      vector<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
      ::_S_relocate((_other->groups).
                    super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (_other->groups).
                    super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                    ._M_impl.super__Vector_impl_data._M_finish,__result,(_Tp_alloc_type *)_Var26);
      pRVar5 = (pMVar35->groups).
               super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (pRVar5 != (pointer)0x0) {
        operator_delete(pRVar5,(long)(pMVar35->groups).
                                     super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pRVar5);
      }
      (pMVar35->groups).
      super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = __result;
      (pMVar35->groups).
      super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)(((long)pRVar4 - (long)pRVar17) + (long)__result);
      (pMVar35->groups).
      super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)p_Var28;
    }
    _Var26 = (_Storage<wasm::HeapType,_true>)
             (pMVar35->types).super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
             _M_impl.super__Vector_impl_data._M_start;
    fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(pMVar35->types).
                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    auStack_228[0] = 0;
    local_218 = 0;
    local_208 = 0;
    _Stack_298 = _Var26;
    std::
    _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _Hashtable<__gnu_cxx::__normal_iterator<wasm::HeapType_const*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
              ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&local_200,_Var26,
               fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
               super__Vector_impl_data._M_start,0,&local_1b8,auStack_148,auStack_88);
    local_1b8 = (_Storage<wasm::HeapType,_true>)&_Stack_298;
    SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
    ::Iterator::operator++((Iterator *)&local_1b8._M_value);
    local_50 = local_1b8;
    this_02 = &_other->equivalenceClasses;
    this_03 = &_other->shapesToUpdate;
    __begin2.scc.parent = (SCC)&_other->groupShapeIndices;
LAB_00988495:
    _Var11 = local_50;
    if (local_50 != (_Storage<wasm::HeapType,_true>)0x0) {
      sVar15 = DisjointSets::addSet(this_02);
      pMVar35 = _other;
      local_8c = (uint)sVar15;
      __first = (_other->groups).
                super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pRVar18 = (_other->groups).
                super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar30 = (long)pRVar18 - (long)__first;
      uVar16 = lVar30 >> 8;
      if ((sVar15 & 0xffffffff) != uVar16) {
        __assert_fail("index == groups.size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                      ,0x1a1,
                      "virtual void wasm::(anonymous namespace)::MinimizeRecGroups::run(Module *)");
      }
      if (pRVar18 ==
          (_other->groups).
          super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        if (lVar30 == 0x7fffffffffffff00) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar27 = uVar16;
        if (pRVar18 == __first) {
          uVar27 = 1;
        }
        p_Var28 = (_Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                   *)(uVar27 + uVar16);
        if ((_Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
             *)0x7ffffffffffffe < p_Var28) {
          p_Var28 = (_Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                     *)0x7fffffffffffff;
        }
        __alloc = (_Tp_alloc_type *)(uVar27 + uVar16);
        if (CARRY8(uVar27,uVar16)) {
          p_Var28 = (_Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                     *)0x7fffffffffffff;
        }
        pRVar17 = std::
                  _Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                  ::_M_allocate(p_Var28,(size_t)_Var26);
        memset((void *)(lVar30 + (long)pRVar17),0,0x100);
        pRVar18 = std::
                  vector<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                  ::_S_relocate(__first,pRVar18,pRVar17,__alloc);
        pMVar35 = _other;
        types = extraout_RDX_00;
        if (__first != (pointer)0x0) {
          operator_delete(__first,(long)(_other->groups).
                                        super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)__first);
          types = extraout_RDX_01;
        }
        (pMVar35->groups).
        super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
        ._M_impl.super__Vector_impl_data._M_start = pRVar17;
        (pMVar35->groups).
        super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = pRVar18 + 1;
        (pMVar35->groups).
        super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = pRVar17 + (long)p_Var28;
      }
      else {
        memset(pRVar18,0,0x100);
        ppRVar3 = &(pMVar35->groups).
                   super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppRVar3 = *ppRVar3 + 1;
        types = extraout_RDX;
      }
      if ((_Var11 == (_Storage<wasm::HeapType,_true>)0x0) ||
         (*(char *)((long)_Var11 + 0x90) != '\x01')) {
        uVar12 = 0;
      }
      else {
        publicGroups._M_h._M_single_bucket =
             *(__node_base_ptr *)
              ((long)*(_Storage<wasm::HeapType,_true> *)((long)_Var11 + 0x30) + -8);
        uVar12 = 1;
      }
      _auStack_88 = (_Storage<wasm::HeapType,_true> *)0x0;
      sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1b8 = _Var11;
      outputIndices._M_h._M_buckets = &(publicGroups._M_h._M_single_bucket)->_M_nxt;
      outputIndices._M_h._M_bucket_count = CONCAT71(outputIndices._M_h._M_bucket_count._1_7_,uVar12)
      ;
      while ((local_1b8 != (_Storage<wasm::HeapType,_true>)0x0 &&
             (*(char *)((long)local_1b8 + 0x90) == '\x01'))) {
        auStack_148 = (undefined1  [8])outputIndices._M_h._M_buckets;
        if (sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_start ==
            sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
          _M_realloc_insert<wasm::HeapType>
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)auStack_88,
                     (iterator)
                     sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                     _M_impl.super__Vector_impl_data._M_start,(HeapType *)auStack_148);
        }
        else {
          (sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_start)->id = (uintptr_t)outputIndices._M_h._M_buckets;
          sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_start =
               sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
        ::SCC::Iterator::operator++((Iterator *)&local_1b8._M_value);
        types = extraout_RDX_02;
      }
      createSubtypeGraph((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          *)local_d0,(anon_unknown_0 *)auStack_88,types);
      TopologicalOrdersImpl<std::monostate>::TopologicalOrdersImpl
                ((TopologicalOrdersImpl<std::monostate> *)auStack_148,
                 (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)local_d0);
      TopologicalOrdersImpl<std::monostate>::TopologicalOrdersImpl
                ((TopologicalOrdersImpl<std::monostate> *)&local_1b8,auStack_148);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &deps.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 &outputIndices._M_h._M_element_count);
      if (local_160 != (void *)0x0) {
        operator_delete(local_160,local_150 - (long)local_160);
      }
      if (outputIndices._M_h._M_single_bucket != (__node_base_ptr)0x0) {
        operator_delete(outputIndices._M_h._M_single_bucket,
                        local_170 - (long)outputIndices._M_h._M_single_bucket);
      }
      pvVar9 = (void *)CONCAT44(outputIndices._M_h._M_element_count._4_4_,
                                (undefined4)outputIndices._M_h._M_element_count);
      if (pvVar9 != (void *)0x0) {
        operator_delete(pvVar9,outputIndices._M_h._M_rehash_policy._M_next_resize - (long)pvVar9);
      }
      if (outputIndices._M_h._M_buckets != (__buckets_ptr)0x0) {
        operator_delete(outputIndices._M_h._M_buckets,
                        (long)outputIndices._M_h._M_before_begin._M_nxt -
                        (long)outputIndices._M_h._M_buckets);
      }
      if (local_f0 != (pointer)0x0) {
        operator_delete(local_f0,(long)local_e0 - (long)local_f0);
      }
      if (local_110 != (pointer)0x0) {
        operator_delete(local_110,(long)local_100 - (long)local_110);
      }
      pvVar9 = (void *)CONCAT44(uStack_124,local_128);
      if (pvVar9 != (void *)0x0) {
        operator_delete(pvVar9,(long)p_Stack_118 - (long)pvVar9);
      }
      if (group.id != 0) {
        operator_delete((void *)group.id,(long)puStack_130 - group.id);
      }
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::resize
                (&(_other->groups).
                  super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].group,
                 (long)sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                       _M_impl.super__Vector_impl_data._M_start - _auStack_88 >> 3);
      if ((long)sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                .super__Vector_impl_data._M_start - _auStack_88 != 0) {
        pHVar24 = (_other->groups).
                  super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].group.
                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar16 = 0;
        do {
          *(_Storage<wasm::HeapType,_true> *)(pHVar24 + uVar16) =
               *(_Storage<wasm::HeapType,_true> *)
                (_auStack_88 +
                (ulong)*(uint *)((long)&((deps.
                                          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar16 * 4) * 8
                );
          uVar16 = uVar16 + 1;
        } while ((uVar16 & 0xffffffff) <
                 (ulong)((long)sccTypes.
                               super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                               _M_impl.super__Vector_impl_data._M_start - _auStack_88 >> 3));
      }
      _Var26 = (_Storage<wasm::HeapType,_true>)
               (_other->shapesToUpdate).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((_Storage<wasm::HeapType,_true>)
          (_other->shapesToUpdate).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_start != _Var26) {
        __assert_fail("shapesToUpdate.empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                      ,0x1ad,
                      "virtual void wasm::(anonymous namespace)::MinimizeRecGroups::run(Module *)");
      }
      uVar33 = local_8c;
      if (_Var26 == (_Storage<wasm::HeapType,_true>)
                    (_other->shapesToUpdate).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_03,
                   (iterator)_Var26._M_value.id,&local_8c);
        goto LAB_00988829;
      }
      do {
        *(uint *)_Var26 = uVar33;
        _Var26 = (_Storage<wasm::HeapType,_true>)((long)_Var26 + 4);
        (_other->shapesToUpdate).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)_Var26;
LAB_00988829:
        do {
          puVar6 = (_other->shapesToUpdate).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if ((_other->shapesToUpdate).
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start == puVar6) {
            if (deps.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
              _Var26 = (_Storage<wasm::HeapType,_true>)
                       ((long)permutation.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                       (long)deps.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
              operator_delete(deps.
                              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)_Var26);
            }
            std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       *)local_d0);
            if ((_Storage<wasm::HeapType,_true> *)_auStack_88 !=
                (_Storage<wasm::HeapType,_true> *)0x0) {
              _Var26 = (_Storage<wasm::HeapType,_true>)
                       ((long)sccTypes.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_finish - _auStack_88);
              operator_delete((void *)_auStack_88,(ulong)_Var26);
            }
            SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
            ::Iterator::operator++((Iterator *)&local_50._M_value);
            goto LAB_00988495;
          }
          uVar33 = puVar6[-1];
          (_other->shapesToUpdate).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = puVar6 + -1;
          auStack_148._0_4_ = uVar33;
          local_1b8 = (_Storage<wasm::HeapType,_true>)
                      ((_other->groups).
                       super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar33);
          outputIndices._M_h._M_buckets =
               (__buckets_ptr)CONCAT44(outputIndices._M_h._M_buckets._4_4_,uVar33);
          _Var26 = (_Storage<wasm::HeapType,_true>)&local_1b8;
          pVar39 = std::
                   _Hashtable<wasm::RecGroupShape,std::pair<wasm::RecGroupShape_const,unsigned_int>,std::allocator<std::pair<wasm::RecGroupShape_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::RecGroupShape>,std::hash<wasm::RecGroupShape>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                   ::_M_emplace<std::pair<wasm::RecGroupShape_const,unsigned_int>>
                             ((_Hashtable<wasm::RecGroupShape,std::pair<wasm::RecGroupShape_const,unsigned_int>,std::allocator<std::pair<wasm::RecGroupShape_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::RecGroupShape>,std::hash<wasm::RecGroupShape>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                               *)__begin2.scc.parent);
          pMVar35 = _other;
        } while (((undefined1  [16])pVar39 & (undefined1  [16])0x1) != (undefined1  [16])0x0);
        __args = (_other->groups).
                 super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start + ((ulong)auStack_148 & 0xffffffff);
        sVar15 = DisjointSets::getRoot(this_02,(ulong)auStack_148 & 0xffffffff);
        __h_2._0_4_ = *(uint *)((long)pVar39.first.
                                      super__Node_iterator_base<std::pair<const_wasm::RecGroupShape,_unsigned_int>,_true>
                                      ._M_cur + 0x10);
        uVar16 = (ulong)(uint)__h_2;
        pRVar17 = (pMVar35->groups).
                  super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        uVar33 = (uint)sVar15;
        if (uVar16 == 0xffffffff) {
          if (pRVar17[sVar15 & 0xffffffff].classInfo.
              super__Optional_base<wasm::(anonymous_namespace)::GroupClassInfo,_false,_false>.
              _M_payload.
              super__Optional_payload<wasm::(anonymous_namespace)::GroupClassInfo,_true,_false,_false>
              .super__Optional_payload_base<wasm::(anonymous_namespace)::GroupClassInfo>._M_engaged
              == true) {
            GroupClassInfo::advance((GroupClassInfo *)&pRVar17[sVar15 & 0xffffffff].classInfo);
            GroupClassInfo::permute
                      ((GroupClassInfo *)&pRVar17[sVar15 & 0xffffffff].classInfo,__args);
          }
          else {
            if (auStack_148._0_4_ != uVar33) {
              __assert_fail("group == groupRep",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                            ,0x208,
                            "void wasm::(anonymous namespace)::MinimizeRecGroups::updateShape(Index)"
                           );
            }
            getCanonicalPermutation
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_1b8._M_value,
                       _other,&__args->group);
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                      (&__args->permutation,&local_1b8);
            if (local_1b8 != (_Storage<wasm::HeapType,_true>)0x0) {
              operator_delete((void *)local_1b8,outputIndices._M_h._M_bucket_count - (long)local_1b8
                             );
            }
            std::optional<wasm::(anonymous_namespace)::GroupClassInfo>::
            emplace<wasm::(anonymous_namespace)::RecGroupInfo&>(&__args->classInfo,__args);
            GroupClassInfo::permute((GroupClassInfo *)&__args->classInfo,__args);
          }
        }
        else {
          sVar19 = DisjointSets::getRoot(this_02,uVar16);
          uVar27 = sVar15 & 0xffffffff;
          pRVar4 = (pMVar35->groups).
                   super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          poVar31 = &pRVar4[uVar27].classInfo;
          bVar13 = pRVar4[uVar27].classInfo.
                   super__Optional_base<wasm::(anonymous_namespace)::GroupClassInfo,_false,_false>.
                   _M_payload.
                   super__Optional_payload<wasm::(anonymous_namespace)::GroupClassInfo,_true,_false,_false>
                   .super__Optional_payload_base<wasm::(anonymous_namespace)::GroupClassInfo>.
                   _M_engaged;
          uVar32 = (uint)sVar19;
          if (uVar33 == uVar32) {
            if (bVar13 == false) {
              __assert_fail("groups[groupRep].classInfo",
                            "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                            ,0x218,
                            "void wasm::(anonymous namespace)::MinimizeRecGroups::updateShape(Index)"
                           );
            }
            GroupClassInfo::advanceBrand((GroupClassInfo *)poVar31);
            GroupClassInfo::permute((GroupClassInfo *)poVar31,__args);
          }
          else {
            __args_00 = pRVar17 + uVar16;
            uVar16 = sVar19 & 0xffffffff;
            local_1c0 = (GroupClassInfo *)poVar31;
            if (bVar13 == false) {
              if (pRVar4[uVar16].classInfo.
                  super__Optional_base<wasm::(anonymous_namespace)::GroupClassInfo,_false,_false>.
                  _M_payload.
                  super__Optional_payload<wasm::(anonymous_namespace)::GroupClassInfo,_true,_false,_false>
                  .super__Optional_payload_base<wasm::(anonymous_namespace)::GroupClassInfo>.
                  _M_engaged != true) {
                if ((auStack_148._0_4_ != uVar33) || ((uint)__h_2 != uVar32)) {
                  __assert_fail("group == groupRep && other == otherRep",
                                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                                ,0x265,
                                "void wasm::(anonymous namespace)::MinimizeRecGroups::updateShape(Index)"
                               );
                }
                std::
                _Hashtable<wasm::RecGroupShape,_std::pair<const_wasm::RecGroupShape,_unsigned_int>,_std::allocator<std::pair<const_wasm::RecGroupShape,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::RecGroupShape>,_std::hash<wasm::RecGroupShape>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::erase((_Hashtable<wasm::RecGroupShape,_std::pair<const_wasm::RecGroupShape,_unsigned_int>,_std::allocator<std::pair<const_wasm::RecGroupShape,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::RecGroupShape>,_std::hash<wasm::RecGroupShape>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                         *)__begin2.scc.parent,
                        (_Node_iterator_base<std::pair<const_wasm::RecGroupShape,_unsigned_int>,_true>
                         )pVar39.first.
                          super__Node_iterator_base<std::pair<const_wasm::RecGroupShape,_unsigned_int>,_true>
                          ._M_cur);
                getCanonicalPermutation
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &local_1b8._M_value,_other,&__args->group);
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
                          (&__args_00->permutation,&local_1b8);
                std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                          (&__args->permutation,&__args_00->permutation);
                poVar31 = &__args_00->classInfo;
                std::optional<wasm::(anonymous_namespace)::GroupClassInfo>::
                emplace<wasm::(anonymous_namespace)::RecGroupInfo&>(poVar31,__args_00);
                GroupClassInfo::permute((GroupClassInfo *)poVar31,__args_00);
                GroupClassInfo::permute((GroupClassInfo *)poVar31,__args);
                __position_00._M_current =
                     (_other->shapesToUpdate).
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
                if (__position_00._M_current ==
                    (_other->shapesToUpdate).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_03,
                             __position_00,(uint *)auStack_148);
                }
                else {
                  *__position_00._M_current = auStack_148._0_4_;
                  (_other->shapesToUpdate).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish = __position_00._M_current + 1;
                }
                _Var26 = (_Storage<wasm::HeapType,_true>)
                         (_other->shapesToUpdate).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_finish;
                if (_Var26 == (_Storage<wasm::HeapType,_true>)
                              (_other->shapesToUpdate).
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<unsigned_int,std::allocator<unsigned_int>>::
                  _M_realloc_insert<unsigned_int_const&>
                            ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_03,
                             (iterator)_Var26._M_value.id,(uint *)&__h_2);
                }
                else {
                  *(uint *)_Var26 = (uint)__h_2;
                  _Var26 = (_Storage<wasm::HeapType,_true>)((long)_Var26 + 4);
                  (_other->shapesToUpdate).
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish = (pointer)_Var26;
                }
                if (local_1b8 != (_Storage<wasm::HeapType,_true>)0x0) {
                  _Var26 = (_Storage<wasm::HeapType,_true>)
                           (outputIndices._M_h._M_bucket_count - (long)local_1b8);
                  operator_delete((void *)local_1b8,(ulong)_Var26);
                }
                goto LAB_00988829;
              }
              sVar15 = DisjointSets::getUnion(this_02,uVar16,uVar27);
              if (uVar32 != (uint)sVar15) {
                __assert_fail("otherRep == unionRep",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                              ,0x254,
                              "void wasm::(anonymous namespace)::MinimizeRecGroups::updateShape(Index)"
                             );
              }
              std::_Optional_payload_base<wasm::(anonymous_namespace)::GroupClassInfo>::_M_reset
                        ((_Optional_payload_base<wasm::(anonymous_namespace)::GroupClassInfo> *)
                         &__args->classInfo);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        (&__args->permutation,&__args_00->permutation);
              GroupClassInfo::advance((GroupClassInfo *)&pRVar4[uVar16].classInfo);
              GroupClassInfo::permute((GroupClassInfo *)&pRVar4[uVar16].classInfo,__args);
            }
            else if (pRVar4[uVar16].classInfo.
                     super__Optional_base<wasm::(anonymous_namespace)::GroupClassInfo,_false,_false>
                     ._M_payload.
                     super__Optional_payload<wasm::(anonymous_namespace)::GroupClassInfo,_true,_false,_false>
                     .super__Optional_payload_base<wasm::(anonymous_namespace)::GroupClassInfo>.
                     _M_engaged == true) {
              GroupClassInfo::advance((GroupClassInfo *)poVar31);
              GroupClassInfo::permute((GroupClassInfo *)poVar31,__args);
            }
            else {
              sVar15 = DisjointSets::getUnion(this_02,uVar27,uVar16);
              if (uVar33 != (uint)sVar15) {
                __assert_fail("groupRep == unionRep",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                              ,0x23f,
                              "void wasm::(anonymous namespace)::MinimizeRecGroups::updateShape(Index)"
                             );
              }
              std::_Optional_payload_base<wasm::(anonymous_namespace)::GroupClassInfo>::_M_reset
                        ((_Optional_payload_base<wasm::(anonymous_namespace)::GroupClassInfo> *)
                         &__args_00->classInfo);
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        (&__args_00->permutation,&__args->permutation);
              this_04 = local_1c0;
              GroupClassInfo::advance(local_1c0);
              GroupClassInfo::permute(this_04,__args);
            }
          }
        }
        _Var26 = (_Storage<wasm::HeapType,_true>)
                 (_other->shapesToUpdate).
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        if (_Var26 == (_Storage<wasm::HeapType,_true>)
                      (_other->shapesToUpdate).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)this_03,
                     (iterator)_Var26._M_value.id,(uint *)auStack_148);
          goto LAB_00988829;
        }
        uVar33 = auStack_148._0_4_;
      } while( true );
    }
    std::
    _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_200);
    memset(auStack_228,0,8);
    if (fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
        super__Vector_impl_data._M_finish != (pointer)0x0) {
      operator_delete(fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                      super__Vector_impl_data._M_finish,
                      -(long)fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                             _M_impl.super__Vector_impl_data._M_finish);
    }
    local_1b8 = (_Storage<wasm::HeapType,_true>)&outputIndices._M_h._M_rehash_policy._M_next_resize;
    outputIndices._M_h._M_buckets = (__buckets_ptr)0x1;
    outputIndices._M_h._M_bucket_count = 0;
    outputIndices._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    outputIndices._M_h._M_element_count._0_4_ = 0x3f800000;
    outputIndices._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    outputIndices._M_h._M_rehash_policy._4_4_ = 0;
    outputIndices._M_h._M_rehash_policy._M_next_resize = 0;
    SVar38.parent =
         (SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
          *)(_other->groups).
            super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
    __begin2.scc.parent =
         (SCC)(_other->groups).
              super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    sVar15 = 0;
    if ((SCC)SVar38.parent != __begin2.scc.parent) {
      do {
        if ((((pointer)SVar38.parent)->group).
            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (((pointer)SVar38.parent)->group).
            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar33 = 1;
          uVar16 = 0;
          do {
            if ((((pointer)SVar38.parent)->hasBrand != true) ||
               ((((pointer)SVar38.parent)->permutation).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar16] != 0)) {
              _Stack_298 = *(_Storage<wasm::HeapType,_true> *)
                            ((((pointer)SVar38.parent)->group).
                             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                             _M_impl.super__Vector_impl_data._M_start + uVar16);
              fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(fields.
                                     super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                                     (int)sVar15 + uVar33 + -1);
              std::
              _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              ::_M_emplace<std::pair<wasm::HeapType_const,unsigned_int>>
                        ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                          *)&local_1b8,&_Stack_298);
            }
            uVar16 = (ulong)uVar33;
            uVar33 = uVar33 + 1;
          } while (uVar16 < (ulong)((long)(((pointer)SVar38.parent)->group).
                                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(((pointer)SVar38.parent)->group).
                                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 3));
          sVar15 = (size_t)(((int)sVar15 + uVar33) - 1);
        }
        SVar38.parent = SVar38.parent + 0x100;
      } while ((SCC)SVar38.parent != __begin2.scc.parent);
    }
    TypeBuilder::TypeBuilder((TypeBuilder *)&__h_2,sVar15);
    pRVar17 = (_other->groups).
              super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pRVar4 = (_other->groups).
             super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pRVar17 != pRVar4) {
      SVar38.parent =
           (SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
            *)0x0;
      do {
        TypeBuilder::createRecGroup
                  ((TypeBuilder *)&__h_2,(size_t)SVar38.parent,
                   (long)(pRVar17->group).
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_finish -
                   (long)(pRVar17->group).
                         super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                         .super__Vector_impl_data._M_start >> 3);
        pHVar7 = (pRVar17->group).
                 super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pHVar24 = (pRVar17->group).
                       super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                       super__Vector_impl_data._M_start; pHVar24 != pHVar7; pHVar24 = pHVar24 + 1) {
          local_50 = (_Storage<wasm::HeapType,_true>)pHVar24->id;
          _auStack_88 = &local_1b8;
          sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)&__h_2;
          if ((ulong)local_50 < 0x7d) {
            __assert_fail("!type.isBasic()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                          ,0x2df,
                          "void wasm::TypeBuilder::copyHeapType(size_t, HeapType, F) [F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp:834:33)]"
                         );
          }
          oVar40 = HeapType::getDeclaredSuperType(&local_50._M_value);
          __begin2.scc.parent = (SCC)(SCC)SVar38.parent;
          if (((undefined1  [16])
               oVar40.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
              (undefined1  [16])0x0) {
            _Stack_298 = oVar40.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::HeapType>._M_payload;
            iVar20 = std::
                     _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)_auStack_88,&_Stack_298._M_value);
            _Var26 = _Stack_298;
            if (iVar20.
                super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
                _M_cur != (__node_type *)0x0) {
              _Var26._M_value =
                   TypeBuilder::getTempHeapType
                             ((TypeBuilder *)
                              sccTypes.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (ulong)*(uint *)((long)iVar20.
                                                  super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                                  ._M_cur + 0x10));
            }
            oVar40.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
            oVar40.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
                 (HeapType)(HeapType)_Var26;
            TypeBuilder::setSubType((TypeBuilder *)&__h_2,(size_t)__begin2.scc.parent,oVar40);
          }
          oVar40 = HeapType::getDescriptorType(&local_50._M_value);
          if (((undefined1  [16])
               oVar40.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
              (undefined1  [16])0x0) {
            _Stack_298 = oVar40.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::HeapType>._M_payload;
            iVar20 = std::
                     _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)_auStack_88,&_Stack_298._M_value);
            _Var26 = _Stack_298;
            if (iVar20.
                super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
                _M_cur != (__node_type *)0x0) {
              _Var26._M_value =
                   TypeBuilder::getTempHeapType
                             ((TypeBuilder *)
                              sccTypes.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (ulong)*(uint *)((long)iVar20.
                                                  super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                                  ._M_cur + 0x10));
            }
            desc.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
            desc.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
                 (HeapType)(HeapType)_Var26;
            TypeBuilder::setDescriptor((TypeBuilder *)&__h_2,(size_t)__begin2.scc.parent,desc);
          }
          oVar40 = HeapType::getDescribedType(&local_50._M_value);
          if (((undefined1  [16])
               oVar40.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
              (undefined1  [16])0x0) {
            _Stack_298 = oVar40.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::HeapType>._M_payload;
            iVar20 = std::
                     _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)_auStack_88,&_Stack_298._M_value);
            _Var26 = _Stack_298;
            if (iVar20.
                super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
                _M_cur != (__node_type *)0x0) {
              _Var26._M_value =
                   TypeBuilder::getTempHeapType
                             ((TypeBuilder *)
                              sccTypes.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (ulong)*(uint *)((long)iVar20.
                                                  super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                                  ._M_cur + 0x10));
            }
            desc_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
            desc_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
                 (HeapType)(HeapType)_Var26;
            TypeBuilder::setDescribed((TypeBuilder *)&__h_2,(size_t)__begin2.scc.parent,desc_00);
          }
          bVar13 = HeapType::isOpen(&local_50._M_value);
          TypeBuilder::setOpen((TypeBuilder *)&__h_2,(size_t)__begin2.scc.parent,bVar13);
          share = HeapType::getShared(&local_50._M_value);
          TypeBuilder::setShared((TypeBuilder *)&__h_2,(size_t)__begin2.scc.parent,share);
          local_d0 = (undefined1  [8])&__h_2;
          deps.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_88;
          deps.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_d0;
          HVar14 = HeapType::getKind(&local_50._M_value);
          switch(HVar14) {
          case Basic:
            handle_unreachable("unexpected kind",
                               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                               ,0x31b);
          case Func:
            SVar41 = HeapType::getSignature(&local_50._M_value);
            TVar21 = TypeBuilder::
                     copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp:834:33)>
                     ::anon_class_16_2_ecc023e0::operator()
                               ((anon_class_16_2_ecc023e0 *)
                                &deps.
                                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,SVar41.params.id
                               );
            TVar22 = TypeBuilder::
                     copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp:834:33)>
                     ::anon_class_16_2_ecc023e0::operator()
                               ((anon_class_16_2_ecc023e0 *)
                                &deps.
                                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                SVar41.results.id);
            SVar41.results.id = TVar22.id;
            SVar41.params.id = TVar21.id;
            TypeBuilder::setHeapType((TypeBuilder *)&__h_2,(size_t)__begin2.scc.parent,SVar41);
            break;
          case Struct:
            pSVar23 = HeapType::getStruct(&local_50._M_value);
            _Stack_298 = (_Storage<wasm::HeapType,_true>)0x0;
            fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            std::vector<wasm::Field,_std::allocator<wasm::Field>_>::reserve
                      ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)&_Stack_298._M_value,
                       (long)(pSVar23->fields).
                             super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)(pSVar23->fields).
                             super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                             super__Vector_impl_data._M_start >> 4);
            pFVar8 = (pSVar23->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            for (pFVar36 = (pSVar23->fields).
                           super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                           super__Vector_impl_data._M_start; pFVar36 != pFVar8;
                pFVar36 = pFVar36 + 1) {
              auStack_148 = (undefined1  [8])(pFVar36->type).id;
              group.id._0_4_ = pFVar36->packedType;
              group.id._4_4_ = pFVar36->mutable_;
              auStack_148 = (undefined1  [8])
                            TypeBuilder::
                            copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp:834:33)>
                            ::anon_class_16_2_ecc023e0::operator()
                                      ((anon_class_16_2_ecc023e0 *)
                                       &deps.
                                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                       (Type)auStack_148);
              if (fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<wasm::Field,std::allocator<wasm::Field>>::
                _M_realloc_insert<wasm::Field_const&>
                          ((vector<wasm::Field,std::allocator<wasm::Field>> *)&_Stack_298._M_value,
                           (iterator)
                           fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                           _M_impl.super__Vector_impl_data._M_start,(Field *)auStack_148);
              }
              else {
                ((fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                  super__Vector_impl_data._M_start)->type).id = (uintptr_t)auStack_148;
                (fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                 super__Vector_impl_data._M_start)->packedType = (undefined4)group.id;
                (fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                 super__Vector_impl_data._M_start)->mutable_ = group.id._4_4_;
                fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                super__Vector_impl_data._M_start =
                     fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                     super__Vector_impl_data._M_start + 1;
              }
            }
            std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                      ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_148,
                       (vector<wasm::Field,_std::allocator<wasm::Field>_> *)&_Stack_298._M_value);
            TypeBuilder::setHeapType
                      ((TypeBuilder *)&__h_2,(size_t)__begin2.scc.parent,(Struct *)auStack_148);
            if (auStack_148 != (undefined1  [8])0x0) {
              operator_delete((void *)auStack_148,(long)local_138._M_nxt - (long)auStack_148);
            }
            if (_Stack_298 != (_Storage<wasm::HeapType,_true>)0x0) {
              operator_delete((void *)_Stack_298,
                              (long)fields.
                                    super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                                    _M_impl.super__Vector_impl_data._M_finish - (long)_Stack_298);
            }
            break;
          case Array:
            HeapType::getArray(&_Stack_298._M_value);
            pFVar36 = fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                      super__Vector_impl_data._M_start;
            _Stack_298._M_value.id =
                 (HeapType)
                 TypeBuilder::
                 copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp:834:33)>
                 ::anon_class_16_2_ecc023e0::operator()
                           ((anon_class_16_2_ecc023e0 *)
                            &deps.
                             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (Type)_Stack_298._M_value.id);
            fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
            super__Vector_impl_data._M_start = pFVar36;
            TypeBuilder::setHeapType
                      ((TypeBuilder *)&__h_2,(size_t)__begin2.scc.parent,
                       (Array *)&_Stack_298._M_value);
            break;
          case Cont:
            _Stack_298._M_value.id = (HeapType)HeapType::getContinuation(&local_50._M_value);
            iVar20 = std::
                     _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                             *)_auStack_88,&_Stack_298._M_value);
            _Var26 = _Stack_298;
            if (iVar20.
                super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
                _M_cur != (__node_type *)0x0) {
              _Var26._M_value =
                   TypeBuilder::getTempHeapType
                             ((TypeBuilder *)
                              sccTypes.
                              super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (ulong)*(uint *)((long)iVar20.
                                                  super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                                  ._M_cur + 0x10));
            }
            TypeBuilder::setHeapType
                      ((TypeBuilder *)&__h_2,(size_t)__begin2.scc.parent,
                       (Continuation)_Var26._M_value.id);
          }
          SVar38.parent =
               (SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
                *)(ulong)((int)SVar38.parent + 1);
        }
        pRVar17 = pRVar17 + 1;
      } while (pRVar17 != pRVar4);
    }
    TypeBuilder::build((BuildResult *)auStack_88,(TypeBuilder *)&__h_2);
    if ((byte)sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage != 0) {
      __assert_fail("built",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/MinimizeRecGroups.cpp"
                    ,0x34b,
                    "void wasm::(anonymous namespace)::MinimizeRecGroups::rewriteTypes(Module &)");
    }
    __x = std::
          get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                    ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                      *)auStack_88);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_d0,__x);
    auStack_148 = (undefined1  [8])&p_Stack_118;
    group.id = 1;
    p_Stack_118 = (__node_base_ptr)0x0;
    SVar38.parent =
         (SCCs<__gnu_cxx::__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_wasm::(anonymous_namespace)::TypeSCCs>
          *)(_other->groups).
            super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
    __begin2.scc.parent =
         (SCC)(_other->groups).
              super__Vector_base<wasm::(anonymous_namespace)::RecGroupInfo,_std::allocator<wasm::(anonymous_namespace)::RecGroupInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((SCC)SVar38.parent != __begin2.scc.parent) {
      iVar29 = 0;
      do {
        pHVar24 = (((pointer)SVar38.parent)->group).
                  super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((((pointer)SVar38.parent)->group).
            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_finish != pHVar24) {
          uVar33 = 1;
          uVar16 = 0;
          do {
            auVar10 = local_d0;
            if ((((pointer)SVar38.parent)->hasBrand != true) ||
               ((((pointer)SVar38.parent)->permutation).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar16] != 0)) {
              pmVar25 = std::__detail::
                        _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                        ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                      *)auStack_148,pHVar24 + uVar16);
              pmVar25->id = (uintptr_t)
                            (&(((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)auVar10
                               )->_M_impl).super__Vector_impl_data._M_start)[(iVar29 + uVar33) - 1];
            }
            uVar16 = (ulong)uVar33;
            pHVar24 = (((pointer)SVar38.parent)->group).
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
                      super__Vector_impl_data._M_start;
            uVar33 = uVar33 + 1;
          } while (uVar16 < (ulong)((long)(((pointer)SVar38.parent)->group).
                                          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pHVar24
                                   >> 3));
          iVar29 = iVar29 + uVar33 + -1;
        }
        SVar38.parent = SVar38.parent + 0x100;
      } while ((SCC)SVar38.parent != __begin2.scc.parent);
    }
    GlobalTypeRewriter::GlobalTypeRewriter((GlobalTypeRewriter *)&_Stack_298._M_value,module);
    GlobalTypeRewriter::mapTypes((GlobalTypeRewriter *)&_Stack_298._M_value,(TypeMap *)auStack_148);
    GlobalTypeRewriter::mapTypeNamesAndIndices
              ((GlobalTypeRewriter *)&_Stack_298._M_value,(TypeMap *)auStack_148);
    GlobalTypeRewriter::~GlobalTypeRewriter((GlobalTypeRewriter *)&_Stack_298._M_value);
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)auStack_148);
    if (local_d0 != (undefined1  [8])0x0) {
      operator_delete((void *)local_d0,
                      (long)deps.
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)local_d0);
    }
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
      ::_S_vtable._M_arr
      [(byte)sccTypes.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage]._M_data)
              ((anon_class_1_0_00000001 *)&_Stack_298._M_value,
               (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                *)auStack_88);
    TypeBuilder::~TypeBuilder((TypeBuilder *)&__h_2);
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)&local_1b8._M_value);
    std::
    _Hashtable<wasm::RecGroup,_wasm::RecGroup,_std::allocator<wasm::RecGroup>,_std::__detail::_Identity,_std::equal_to<wasm::RecGroup>,_std::hash<wasm::RecGroup>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::RecGroup,_wasm::RecGroup,_std::allocator<wasm::RecGroup>,_std::__detail::_Identity,_std::equal_to<wasm::RecGroup>,_std::hash<wasm::RecGroup>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&typeInfo.List.
                      super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                      ._M_impl._M_node._M_size);
    while (typeInfo.Map._M_h._M_single_bucket !=
           (__node_base_ptr)&typeInfo.Map._M_h._M_single_bucket) {
      p_Var37 = (typeInfo.Map._M_h._M_single_bucket)->_M_nxt;
      operator_delete(typeInfo.Map._M_h._M_single_bucket,0x20);
      typeInfo.Map._M_h._M_single_bucket = p_Var37;
    }
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_330);
  }
  return;
}

Assistant:

void run(Module* module) override {
    // There are no recursion groups to minimize if GC is not enabled.
    if (!module->features.hasGC()) {
      return;
    }

    initBrandOptions();

    auto typeInfo = ModuleUtils::collectHeapTypeInfo(
      *module,
      ModuleUtils::TypeInclusion::AllTypes,
      ModuleUtils::VisibilityHandling::FindVisibility);

    types.reserve(typeInfo.size());

    // We cannot optimize public types, but we do need to make sure we don't
    // generate new groups with the same shape.
    std::unordered_set<RecGroup> publicGroups;
    for (auto& [type, info] : typeInfo) {
      if (info.visibility == ModuleUtils::Visibility::Private) {
        // We can optimize private types.
        types.push_back(type);
        typeIndices.insert({type, typeIndices.size()});
      } else {
        publicGroups.insert(type.getRecGroup());
      }
    }

    publicGroupTypes.reserve(publicGroups.size());
    for (auto group : publicGroups) {
      publicGroupTypes.emplace_back(group.begin(), group.end());
      [[maybe_unused]] auto [_, inserted] = groupShapeIndices.insert(
        {RecGroupShape(publicGroupTypes.back()), PublicGroupIndex});
      assert(inserted);
    }

    // The number of types to optimize is an upper bound on the number of
    // recursion groups we will emit.
    groups.reserve(types.size());

    // Compute the strongly connected components and ensure they form distinct
    // recursion groups.
    for (auto scc : TypeSCCs(types)) {
      [[maybe_unused]] Index index = equivalenceClasses.addSet();
      assert(index == groups.size());
      groups.emplace_back();

      // The SCC is not necessarily topologically sorted to have the supertypes
      // come first. Fix that.
      std::vector<HeapType> sccTypes(scc.begin(), scc.end());
      auto deps = createSubtypeGraph(sccTypes);
      auto permutation = *TopologicalOrders(deps).begin();
      groups.back().group.resize(sccTypes.size());
      for (Index i = 0; i < sccTypes.size(); ++i) {
        groups.back().group[i] = sccTypes[permutation[i]];
      }
      assert(shapesToUpdate.empty());
      shapesToUpdate.push_back(index);
      updateShapes();
    }

    rewriteTypes(*module);
  }